

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O2

void __thiscall
capnp::compiler::Declaration::Builder::adoptNakedAnnotation
          (Builder *this,Orphan<capnp::compiler::Declaration::AnnotationApplication> *value)

{
  PointerBuilder local_18;
  
  *(undefined2 *)((long)(this->_builder).data + 2) = 0xd;
  local_18.pointer = (this->_builder).pointers + 5;
  local_18.segment = (this->_builder).segment;
  local_18.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::adopt(&local_18,&value->builder);
  return;
}

Assistant:

inline void Declaration::Builder::adoptNakedAnnotation(
    ::capnp::Orphan< ::capnp::compiler::Declaration::AnnotationApplication>&& value) {
  _builder.setDataField<Declaration::Which>(
      ::capnp::bounded<1>() * ::capnp::ELEMENTS, Declaration::NAKED_ANNOTATION);
  ::capnp::_::PointerHelpers< ::capnp::compiler::Declaration::AnnotationApplication>::adopt(_builder.getPointerField(
      ::capnp::bounded<5>() * ::capnp::POINTERS), kj::mv(value));
}